

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionSquare.hpp
# Opt level: O0

void __thiscall
beagle::cpu::EigenDecompositionSquare<double,_1>::setEigenDecomposition
          (EigenDecompositionSquare<double,_1> *this,int eigenIndex,double *inEigenVectors,
          double *inInverseEigenVectors,double *inEigenValues)

{
  int iVar1;
  int in_ESI;
  double *in_RDI;
  int len;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  beagleMemCpy<double>
            ((double *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RDI,0);
  iVar1 = *(int *)(in_RDI + 2) * *(int *)(in_RDI + 2);
  beagleMemCpy<double>((double *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),in_RDI,0);
  beagleMemCpy<double>((double *)CONCAT44(iVar1,in_stack_ffffffffffffffd0),in_RDI,0);
  if (((ulong)in_RDI[4] & 0x200000) != 0) {
    transposeSquareMatrix<double>
              (*(double **)((long)in_RDI[9] + (long)in_ESI * 8),*(int *)(in_RDI + 2));
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>::setEigenDecomposition(int eigenIndex,
										             const double* inEigenVectors,
                                                     const double* inInverseEigenVectors,
                                                     const double* inEigenValues) {
    
	beagleMemCpy(gEigenValues[eigenIndex],inEigenValues,kEigenValuesSize);
	const int len = kStateCount * kStateCount;
	beagleMemCpy(gEMatrices[eigenIndex],inEigenVectors,len);
	beagleMemCpy(gIMatrices[eigenIndex],inInverseEigenVectors,len);
    if (kFlags & BEAGLE_FLAG_INVEVEC_TRANSPOSED) // TODO: optimize, might not need to transpose here
        transposeSquareMatrix(gIMatrices[eigenIndex], kStateCount);
}